

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O0

void __thiscall
spirv_cross::Compiler::PhysicalStorageBufferPointerHandler::PhysicalStorageBufferPointerHandler
          (PhysicalStorageBufferPointerHandler *this,Compiler *compiler_)

{
  Compiler *compiler__local;
  PhysicalStorageBufferPointerHandler *this_local;
  
  OpcodeHandler::OpcodeHandler(&this->super_OpcodeHandler);
  (this->super_OpcodeHandler)._vptr_OpcodeHandler =
       (_func_int **)&PTR__PhysicalStorageBufferPointerHandler_00599408;
  this->compiler = compiler_;
  ::std::
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  ::unordered_set(&this->types);
  return;
}

Assistant:

Compiler::PhysicalStorageBufferPointerHandler::PhysicalStorageBufferPointerHandler(Compiler &compiler_)
    : compiler(compiler_)
{
}